

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dutil.c
# Opt level: O3

void dinf_norm_error(int nrhs,SuperMatrix *X,double *xtrue)

{
  int *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  if (0 < nrhs) {
    piVar1 = (int *)X->Store;
    lVar2 = *(long *)(piVar1 + 2);
    iVar5 = 0;
    do {
      dVar6 = NAN;
      if (0 < (long)X->nrow) {
        auVar7 = ZEXT816(0);
        lVar4 = 0;
        do {
          dVar6 = *(double *)((long)(*piVar1 * iVar5) * 8 + lVar2 + lVar4 * 8);
          auVar3._8_8_ = ABS(dVar6);
          auVar3._0_8_ = ABS(dVar6 - xtrue[lVar4]);
          auVar7 = maxpd(auVar7,auVar3);
          lVar4 = lVar4 + 1;
        } while (X->nrow != lVar4);
        dVar6 = auVar7._0_8_ / auVar7._8_8_;
      }
      printf("||X - Xtrue||/||X|| = %e\n",dVar6);
      iVar5 = iVar5 + 1;
    } while (iVar5 != nrhs);
  }
  return;
}

Assistant:

void dinf_norm_error(int nrhs, SuperMatrix *X, double *xtrue)
{
    DNformat *Xstore;
    double err, xnorm;
    double *Xmat, *soln_work;
    int i, j;

    Xstore = X->Store;
    Xmat = Xstore->nzval;

    for (j = 0; j < nrhs; j++) {
      soln_work = &Xmat[j*Xstore->lda];
      err = xnorm = 0.0;
      for (i = 0; i < X->nrow; i++) {
	err = SUPERLU_MAX(err, fabs(soln_work[i] - xtrue[i]));
	xnorm = SUPERLU_MAX(xnorm, fabs(soln_work[i]));
      }
      err = err / xnorm;
      printf("||X - Xtrue||/||X|| = %e\n", err);
    }
}